

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getaddrinfo.c
# Opt level: O0

ares_addrinfo_node * ares_append_addrinfo_node(ares_addrinfo_node **head)

{
  ares_addrinfo_node *local_28;
  ares_addrinfo_node *last;
  ares_addrinfo_node *tail;
  ares_addrinfo_node **head_local;
  
  head_local = (ares_addrinfo_node **)ares_malloc_zero(0x28);
  local_28 = *head;
  if ((ares_addrinfo_node *)head_local == (ares_addrinfo_node *)0x0) {
    head_local = (ares_addrinfo_node **)0x0;
  }
  else if (local_28 == (ares_addrinfo_node *)0x0) {
    *head = (ares_addrinfo_node *)head_local;
  }
  else {
    for (; local_28->ai_next != (ares_addrinfo_node *)0x0; local_28 = local_28->ai_next) {
    }
    local_28->ai_next = (ares_addrinfo_node *)head_local;
  }
  return (ares_addrinfo_node *)head_local;
}

Assistant:

struct ares_addrinfo_node *
  ares_append_addrinfo_node(struct ares_addrinfo_node **head)
{
  struct ares_addrinfo_node *tail = ares_malloc_zero(sizeof(*tail));
  struct ares_addrinfo_node *last = *head;

  if (tail == NULL) {
    return NULL; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  if (!last) {
    *head = tail;
    return tail;
  }

  while (last->ai_next) {
    last = last->ai_next;
  }

  last->ai_next = tail;
  return tail;
}